

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O3

void __thiscall
CCommandProcessorFragment_OpenGL::Cmd_Texture_Create
          (CCommandProcessorFragment_OpenGL *this,CTextureCreateCommand *pCommand)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  uint NewWidth;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uchar *dest;
  long lVar12;
  int iVar13;
  uchar *source;
  int iVar14;
  long lVar15;
  uchar *pData;
  ulong uVar16;
  float fVar17;
  ulong local_a0;
  uchar *local_88;
  int *local_80;
  
  uVar3 = pCommand->m_Width;
  uVar2 = pCommand->m_Height;
  uVar16 = (ulong)uVar2;
  pData = (uchar *)pCommand->m_pData;
  iVar11 = pCommand->m_Format;
  if (iVar11 - 1U < 2) {
    iVar4 = this->m_MaxTexSize;
    uVar9 = pCommand->m_Flags;
    iVar13 = iVar4;
    if (((((uVar9 & 8) != 0) && (0x3f < this->m_Max3DTexSize)) &&
        (iVar8 = this->m_Max3DTexSize * 0x10, iVar13 = iVar8, (uVar9 & 0x10) != 0)) &&
       (iVar13 = iVar4, iVar8 <= iVar4)) {
      iVar13 = iVar8;
    }
    uVar10 = uVar2;
    NewWidth = uVar3;
    if (iVar13 < (int)uVar2 || iVar13 < (int)uVar3) {
      do {
        NewWidth = (int)NewWidth >> 1;
        uVar10 = (int)uVar10 >> 1;
      } while (iVar13 < (int)uVar10 || iVar13 < (int)NewWidth);
LAB_0011bd07:
      puVar5 = (uchar *)Rescale(uVar3,uVar2,NewWidth,uVar10,iVar11,pData);
      mem_free(pData);
      uVar16 = (ulong)uVar10;
      pData = puVar5;
      uVar3 = NewWidth;
    }
    else if ((char)((uVar9 & 4) >> 2) == '\0' && (0x10 < (int)uVar2 && 0x10 < (int)uVar3)) {
      NewWidth = uVar3 >> 1;
      uVar10 = uVar2 >> 1;
      goto LAB_0011bd07;
    }
    iVar11 = pCommand->m_Format;
    if (iVar11 != 2) goto LAB_0011bdba;
    uVar2 = uVar3 * (int)uVar16;
    if (0 < (int)uVar2) {
      uVar6 = 0;
      do {
        fVar17 = (float)pData[uVar6 * 4 + 3] / 255.0;
        pData[uVar6 * 4] = (uchar)(int)((float)pData[uVar6 * 4] * fVar17);
        pData[uVar6 * 4 + 1] = (uchar)(int)((float)pData[uVar6 * 4 + 1] * fVar17);
        pData[uVar6 * 4 + 2] = (uchar)(int)((float)pData[uVar6 * 4 + 2] * fVar17);
        uVar6 = uVar6 + 1;
      } while (uVar2 != uVar6);
      iVar11 = pCommand->m_Format;
      goto LAB_0011bdba;
    }
    iVar4 = pCommand->m_Slot;
    lVar12 = (long)iVar4;
    this->m_aTextures[lVar12].m_Format = 2;
  }
  else {
LAB_0011bdba:
    iVar4 = pCommand->m_Slot;
    lVar12 = (long)iVar4;
    this->m_aTextures[lVar12].m_Format = iVar11;
    if (iVar11 == 1) {
      uVar7 = 0x1907;
      goto LAB_0011be1b;
    }
    if ((iVar11 != 2) && (iVar11 == 3)) {
      uVar7 = 0x1906;
      goto LAB_0011be1b;
    }
  }
  uVar7 = 0x1908;
LAB_0011be1b:
  local_80 = &pCommand->m_Slot;
  uVar2 = pCommand->m_StoreFormat - 1;
  iVar11 = 0x1908;
  if (uVar2 < 3) {
    iVar11 = *(int *)(&DAT_001d4098 + (ulong)uVar2 * 4);
  }
  uVar2 = pCommand->m_Flags;
  if ((uVar2 & 2) != 0) {
    iVar11 = *(int *)((long)iVar11 * 4 + 0x1cdc8c);
  }
  iVar13 = (int)uVar16;
  if ((uVar2 & 0x10) != 0) {
    glGenTextures(1,this->m_aTextures + lVar12);
    iVar4 = *local_80;
    piVar1 = &this->m_aTextures[iVar4].m_State;
    *piVar1 = *piVar1 | 1;
    glBindTexture(0xde1,this->m_aTextures[iVar4].m_Tex2D);
    glTexParameteri(0xde1,0x2800,0x2601);
    if ((uVar2 & 1) == 0) {
      glTexParameteri(0xde1,0x2801,(uint)((pCommand->m_Flags & 0x20) == 0) << 8 | 0x2601);
      glTexParameteri(0xde1,0x8191,1);
      glTexImage2D(0xde1,0,iVar11,uVar3,uVar16,0,uVar7,0x1401,pData);
      iVar8 = iVar13 * uVar3 * pCommand->m_PixelSize;
      iVar4 = pCommand->m_Slot;
      if ((2 < (int)uVar3) && (uVar6 = uVar16, uVar2 = uVar3, 2 < iVar13)) {
        do {
          iVar8 = (int)(uVar6 >> 1) * pCommand->m_PixelSize * (uVar2 >> 1) + iVar8;
          if (uVar2 < 6) break;
          uVar9 = (uint)uVar6;
          uVar6 = uVar6 >> 1;
          uVar2 = uVar2 >> 1;
        } while (5 < uVar9);
      }
      this->m_aTextures[iVar4].m_MemSize = iVar8;
    }
    else {
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexImage2D(0xde1,0,iVar11,uVar3,uVar16,0,uVar7,0x1401,pData);
      iVar4 = pCommand->m_Slot;
      this->m_aTextures[iVar4].m_MemSize = iVar13 * uVar3 * pCommand->m_PixelSize;
    }
  }
  puVar5 = pData;
  if (((pCommand->m_Flags & 8) != 0) && (uVar2 = this->m_Max3DTexSize, 0x3f < (int)uVar2)) {
    uVar9 = uVar3 + 0xf;
    if (-1 < (int)uVar3) {
      uVar9 = uVar3;
    }
    iVar8 = (int)uVar9 >> 4;
    uVar6 = (ulong)(iVar13 + 0xf);
    if (-1 < iVar13) {
      uVar6 = uVar16;
    }
    uVar3 = (int)(uint)uVar6 >> 4;
    iVar14 = uVar3 * iVar8;
    uVar9 = pCommand->m_PixelSize * iVar14 * 0x100;
    puVar5 = (uchar *)mem_alloc(uVar9);
    iVar4 = pCommand->m_PixelSize;
    uVar10 = iVar4 * iVar8;
    mem_zero(puVar5,uVar9);
    local_a0 = 0;
    lVar12 = 0;
    local_88 = puVar5;
    do {
      if (0xf < iVar13) {
        source = pData + (int)(pCommand->m_PixelSize * iVar8 *
                              (((uint)local_a0 & 0xf) +
                              (int)(local_a0 >> 4) * ((uint)uVar6 & 0xfffffff0)));
        dest = local_88;
        uVar16 = (ulong)uVar3;
        do {
          mem_copy(dest,source,uVar10);
          source = source + (int)(uVar10 * 0x10);
          dest = dest + (int)uVar10;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      lVar12 = lVar12 + 1;
      local_a0 = (ulong)((uint)local_a0 + 1);
      local_88 = local_88 + iVar4 * iVar14;
    } while (lVar12 != 0x100);
    uVar9 = 0x100;
    if (uVar2 < 0x100) {
      uVar9 = uVar2;
    }
    mem_free(pData);
    glGenTextures(this->m_TextureArraySize,this->m_aTextures[*local_80].m_Tex3D);
    iVar4 = *local_80;
    lVar12 = (long)iVar4;
    piVar1 = &this->m_aTextures[lVar12].m_State;
    *piVar1 = *piVar1 | 2;
    if (0 < this->m_TextureArraySize) {
      iVar13 = 0;
      lVar15 = 0;
      do {
        glBindTexture(0x806f,this->m_aTextures[(int)lVar12].m_Tex3D[lVar15]);
        glTexParameteri(0x806f,0x2800,0x2601);
        glTexParameteri(0x806f,0x2801,0x2601);
        glTexImage3D(0x806f,0,iVar11,iVar8,(ulong)uVar3,uVar9,0,uVar7,0x1401,
                     puVar5 + pCommand->m_PixelSize * iVar13);
        iVar4 = pCommand->m_Slot;
        lVar12 = (long)iVar4;
        piVar1 = &this->m_aTextures[lVar12].m_MemSize;
        *piVar1 = *piVar1 + pCommand->m_PixelSize * iVar14;
        lVar15 = lVar15 + 1;
        iVar13 = iVar13 + iVar8 * uVar3 * uVar9;
      } while (lVar15 < this->m_TextureArraySize);
    }
  }
  *this->m_pTextureMemoryUsage = *this->m_pTextureMemoryUsage + this->m_aTextures[iVar4].m_MemSize;
  mem_free(puVar5);
  return;
}

Assistant:

void CCommandProcessorFragment_OpenGL::Cmd_Texture_Create(const CCommandBuffer::CTextureCreateCommand *pCommand)
{
	int Width = pCommand->m_Width;
	int Height = pCommand->m_Height;
	void *pTexData = pCommand->m_pData;

	// resample if needed
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA || pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGB)
	{
		int MaxTexSize = m_MaxTexSize;
		if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
		{
			if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
				MaxTexSize = minimum(MaxTexSize, m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION);
			else
				MaxTexSize = m_Max3DTexSize * IGraphics::NUMTILES_DIMENSION;
		}
		if(Width > MaxTexSize || Height > MaxTexSize)
		{
			do
			{
				Width>>=1;
				Height>>=1;
			}
			while(Width > MaxTexSize || Height > MaxTexSize);

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
		else if(Width > IGraphics::NUMTILES_DIMENSION && Height > IGraphics::NUMTILES_DIMENSION && (pCommand->m_Flags&CCommandBuffer::TEXFLAG_QUALITY) == 0)
		{
			Width>>=1;
			Height>>=1;

			void *pTmpData = Rescale(pCommand->m_Width, pCommand->m_Height, Width, Height, pCommand->m_Format, static_cast<const unsigned char *>(pCommand->m_pData));
			mem_free(pTexData);
			pTexData = pTmpData;
		}
	}

	// use premultiplied alpha for rgba textures
	if(pCommand->m_Format == CCommandBuffer::TEXFORMAT_RGBA)
	{
		unsigned char *pTexels = (unsigned char *)pTexData;
		for(int i = 0; i < Width * Height; ++i)
		{
			const float a = (pTexels[i*4+3]/255.0f);
			pTexels[i*4+0] = (unsigned char)(pTexels[i*4+0] * a);
			pTexels[i*4+1] = (unsigned char)(pTexels[i*4+1] * a);
			pTexels[i*4+2] = (unsigned char)(pTexels[i*4+2] * a);
		}
	}
	m_aTextures[pCommand->m_Slot].m_Format = pCommand->m_Format;

	//
	int Oglformat = TexFormatToOpenGLFormat(pCommand->m_Format);
	int StoreOglformat = TexFormatToOpenGLFormat(pCommand->m_StoreFormat);

	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_COMPRESSED)
	{
		switch(StoreOglformat)
		{
			case GL_RGB: StoreOglformat = GL_COMPRESSED_RGB_ARB; break;
			case GL_ALPHA: StoreOglformat = GL_COMPRESSED_ALPHA_ARB; break;
			case GL_RGBA: StoreOglformat = GL_COMPRESSED_RGBA_ARB; break;
			default: StoreOglformat = GL_COMPRESSED_RGBA_ARB;
		}
	}

	// 2D texture
	if(pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE2D)
	{
		bool Mipmaps = !(pCommand->m_Flags&CCommandBuffer::TEXFLAG_NOMIPMAPS);
		glGenTextures(1, &m_aTextures[pCommand->m_Slot].m_Tex2D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX2D;
		glBindTexture(GL_TEXTURE_2D, m_aTextures[pCommand->m_Slot].m_Tex2D);
		if(!Mipmaps)
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}
		else
		{
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			if(pCommand->m_Flags&CCommandBuffer::TEXTFLAG_LINEARMIPMAPS)
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			else
				glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_GENERATE_MIPMAP, GL_TRUE);
			glTexImage2D(GL_TEXTURE_2D, 0, StoreOglformat, Width, Height, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);
		}

		// calculate memory usage
		m_aTextures[pCommand->m_Slot].m_MemSize = Width*Height*pCommand->m_PixelSize;
		if(Mipmaps)
		{
			int TexWidth = Width;
			int TexHeight = Height;
			while(TexWidth > 2 && TexHeight > 2)
			{
				TexWidth>>=1;
				TexHeight>>=1;
				m_aTextures[pCommand->m_Slot].m_MemSize += TexWidth*TexHeight*pCommand->m_PixelSize;
			}
		}
	}

	// 3D texture
	if((pCommand->m_Flags&CCommandBuffer::TEXFLAG_TEXTURE3D) && m_Max3DTexSize >= CTexture::MIN_GL_MAX_3D_TEXTURE_SIZE)
	{
		Width /= IGraphics::NUMTILES_DIMENSION;
		Height /= IGraphics::NUMTILES_DIMENSION;
		int Depth = minimum(m_Max3DTexSize, IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION);

		// copy and reorder texture data
		int MemSize = Width*Height*IGraphics::NUMTILES_DIMENSION*IGraphics::NUMTILES_DIMENSION*pCommand->m_PixelSize;
		char *pTmpData = (char *)mem_alloc(MemSize);

		const int TileSize = (Height * Width) * pCommand->m_PixelSize;
		const int TileRowSize = Width * pCommand->m_PixelSize;
		const int ImagePitch = Width * IGraphics::NUMTILES_DIMENSION * pCommand->m_PixelSize;
		mem_zero(pTmpData, MemSize);
		for(int i = 0; i < IGraphics::NUMTILES_DIMENSION * IGraphics::NUMTILES_DIMENSION; i++)
		{
			const int px = (i%IGraphics::NUMTILES_DIMENSION) * Width;
			const int py = (i/IGraphics::NUMTILES_DIMENSION) * Height;
			const char *pTileData = (const char *)pTexData + (py * Width * IGraphics::NUMTILES_DIMENSION + px) * pCommand->m_PixelSize;
			for(int y = 0; y < Height; y++)
				mem_copy(pTmpData + i*TileSize + y*TileRowSize, pTileData + y * ImagePitch, TileRowSize);
		}

		mem_free(pTexData);

		//
		glGenTextures(m_TextureArraySize, m_aTextures[pCommand->m_Slot].m_Tex3D);
		m_aTextures[pCommand->m_Slot].m_State |= CTexture::STATE_TEX3D;
		for(int i = 0; i < m_TextureArraySize; ++i)
		{
			glBindTexture(GL_TEXTURE_3D, m_aTextures[pCommand->m_Slot].m_Tex3D[i]);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			pTexData = pTmpData+i*(Width*Height*Depth*pCommand->m_PixelSize);
			glTexImage3D(GL_TEXTURE_3D, 0, StoreOglformat, Width, Height, Depth, 0, Oglformat, GL_UNSIGNED_BYTE, pTexData);

			m_aTextures[pCommand->m_Slot].m_MemSize += Width*Height*pCommand->m_PixelSize;
		}
		pTexData = pTmpData;
	}

	*m_pTextureMemoryUsage += m_aTextures[pCommand->m_Slot].m_MemSize;

	mem_free(pTexData);
}